

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O2

BigInt * __thiscall BigInt::operator-(BigInt *__return_storage_ptr__,BigInt *this,BigInt *that)

{
  pointer plVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  longlong lVar6;
  BigInt res;
  BigInt local_70;
  BigInt local_50;
  
  if (this->sign == that->sign) {
    abs(&local_70,(int)this);
    abs(&local_50,(int)that);
    bVar2 = operator>=(&local_70,&local_50);
    std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
              ((_Vector_base<long_long,_std::allocator<long_long>_> *)&local_50);
    std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
              ((_Vector_base<long_long,_std::allocator<long_long>_> *)&local_70);
    if (bVar2) {
      BigInt(&local_70,this);
      plVar1 = (that->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar3 = (long)(int)((ulong)((long)(that->vector_value).
                                        super__Vector_base<long_long,_std::allocator<long_long>_>.
                                        _M_impl.super__Vector_impl_data._M_finish - (long)plVar1) >>
                         3);
      uVar5 = 0;
      for (lVar4 = 0; ((int)uVar5 != 0 || (lVar4 < lVar3)); lVar4 = lVar4 + 1) {
        if (lVar4 < lVar3) {
          lVar6 = plVar1[lVar4];
        }
        else {
          lVar6 = 0;
        }
        uVar5 = local_70.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar4] - (uVar5 + lVar6);
        local_70.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar4] = uVar5;
        if ((long)uVar5 < 0) {
          local_70.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
          super__Vector_impl_data._M_start[lVar4] = base + uVar5;
        }
        uVar5 = uVar5 >> 0x3f;
      }
      trim(__return_storage_ptr__,&local_70);
    }
    else {
      operator-(&local_70,that,this);
      operator-(__return_storage_ptr__,&local_70);
    }
  }
  else {
    operator-(&local_70,that);
    operator+(__return_storage_ptr__,this,&local_70);
  }
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
            ((_Vector_base<long_long,_std::allocator<long_long>_> *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

BigInt operator-(const BigInt &that) const { //! subtraction operator overloading
        if (sign == that.sign) {
            //! assuming this >= that to implement borrow
            if (abs() >= that.abs()) {
                BigInt res = *this;

                //! keep looping for all digits until exhausted considering the carry
                for (int i = 0, borrow = 0; i < (int) that.vector_value.size() || borrow; ++i) {
                    res.vector_value[i] -= borrow + (i < (int) that.vector_value.size() ? that.vector_value[i] : 0);

                    borrow = res.vector_value[i] < 0; //! if we have borrow this will be negative, borrow it from the next digit

                    if (borrow)
                        res.vector_value[i] += base; //! take the borrow we are guaranteed to find borrow  since a>=b
                }

                return res.trim();
            }
            //!-ve as common factor
            return -(that - *this); //! reorder
        }

        //! A-B have different signs represent them as addition
        return *this + (-that);
    }